

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenscanner.cpp
# Opt level: O2

bool __thiscall TokenScanner::hasMoreTokens(TokenScanner *this)

{
  bool bVar1;
  string token;
  string local_50;
  string local_30;
  
  nextToken_abi_cxx11_(&local_30,this);
  std::__cxx11::string::string((string *)&local_50,(string *)&local_30);
  saveToken(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  bVar1 = std::operator!=(&local_30,"");
  std::__cxx11::string::~string((string *)&local_30);
  return bVar1;
}

Assistant:

bool TokenScanner::hasMoreTokens() {
   string token = nextToken();
   saveToken(token);
   return (token != "");
}